

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::strTree<kj::String,char_const(&)[2]>
          (StringTree *__return_storage_ptr__,kj *this,String *params,char (*params_1) [2])

{
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  ArrayPtr<const_char> *params_1_00;
  StringTree local_60;
  String *local_28;
  char *local_20;
  
  local_60.text.content.size_ = *(size_t *)(this + 8);
  local_60.size_ = 0;
  if (local_60.text.content.size_ != 0) {
    local_60.size_ = local_60.text.content.size_ - 1;
  }
  params_1_00 = *(ArrayPtr<const_char> **)this;
  local_60.text.content.disposer = *(ArrayDisposer **)(this + 0x10);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_60.branches.ptr = (Branch *)0x0;
  local_60.branches.size_ = 0;
  local_60.branches.disposer = (ArrayDisposer *)0x0;
  local_60.text.content.ptr = (char *)params_1_00;
  local_20 = (char *)strlen((char *)params);
  local_28 = params;
  StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,&local_60,(StringTree *)&stack0xffffffffffffffd8,params_1_00);
  sVar2 = local_60.branches.size_;
  pBVar3 = local_60.branches.ptr;
  if (local_60.branches.ptr != (Branch *)0x0) {
    local_60.branches.ptr = (Branch *)0x0;
    local_60.branches.size_ = 0;
    (**(local_60.branches.disposer)->_vptr_ArrayDisposer)
              (local_60.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_60.text.content.size_;
  pcVar1 = local_60.text.content.ptr;
  if ((ArrayPtr<const_char> *)local_60.text.content.ptr != (ArrayPtr<const_char> *)0x0) {
    local_60.text.content.ptr = (char *)0x0;
    local_60.text.content.size_ = 0;
    (**(local_60.text.content.disposer)->_vptr_ArrayDisposer)
              (local_60.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}